

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::RequiredExtensions::add
          (RequiredExtensions *this,char *ext)

{
  pointer ppcVar1;
  deBool dVar2;
  int ndx;
  long lVar3;
  char *local_20;
  
  lVar3 = 0;
  local_20 = ext;
  do {
    ppcVar1 = (this->m_extensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_extensions).
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppcVar1) >> 3) <= lVar3) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                (&this->m_extensions,&local_20);
      return;
    }
    dVar2 = deStringEqual(ppcVar1[lVar3],ext);
    lVar3 = lVar3 + 1;
  } while (dVar2 != 1);
  return;
}

Assistant:

void RequiredExtensions::add (const char* ext)
{
	for (int ndx = 0; ndx < (int)m_extensions.size(); ++ndx)
		if (deStringEqual(m_extensions[ndx], ext) == DE_TRUE)
			return;
	m_extensions.push_back(ext);
}